

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

Vector2f __thiscall Rml::Box::GetPosition(Box *this,BoxArea area)

{
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  if ((area == Auto) &&
     (bVar3 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x29), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  fVar5 = -this->area_edges[0][3];
  fVar6 = -this->area_edges[0][0];
  if (0 < (int)area) {
    lVar4 = 0;
    do {
      fVar5 = *(float *)((long)this->area_edges[0] + lVar4 + 0xc) + fVar5;
      fVar6 = fVar6 + *(float *)((long)this->area_edges[0] + lVar4);
      lVar4 = lVar4 + 0x10;
    } while ((ulong)area << 4 != lVar4);
  }
  VVar2.y = fVar6;
  VVar2.x = fVar5;
  return VVar2;
}

Assistant:

Vector2f Box::GetPosition(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_position(-GetEdge(BoxArea::Margin, BoxEdge::Left), -GetEdge(BoxArea::Margin, BoxEdge::Top));
	for (int i = 0; i < (int)area; i++)
	{
		area_position.x += area_edges[i][(int)BoxEdge::Left];
		area_position.y += area_edges[i][(int)BoxEdge::Top];
	}

	return area_position;
}